

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

BrOn * __thiscall
wasm::Builder::makeBrOn(Builder *this,BrOnOp op,Name name,Expression *ref,Type castType)

{
  BrOn *this_00;
  
  this_00 = (BrOn *)MixedArena::allocSpace(&this->wasm->allocator,0x38,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression._id = BrOnId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression.type.id = 0;
  (this_00->name).super_IString.str._M_len = 0;
  (this_00->name).super_IString.str._M_str = (char *)0x0;
  this_00->op = op;
  (this_00->name).super_IString.str._M_len = name.super_IString.str._M_len;
  (this_00->name).super_IString.str._M_str = name.super_IString.str._M_str;
  this_00->ref = ref;
  (this_00->castType).id = castType.id;
  BrOn::finalize(this_00);
  return this_00;
}

Assistant:

BrOn*
  makeBrOn(BrOnOp op, Name name, Expression* ref, Type castType = Type::none) {
    auto* ret = wasm.allocator.alloc<BrOn>();
    ret->op = op;
    ret->name = name;
    ret->ref = ref;
    ret->castType = castType;
    ret->finalize();
    return ret;
  }